

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

bool __thiscall QListModel::insertRows(QListModel *this,int row,int count,QModelIndex *parent)

{
  int iVar1;
  QListWidget *pQVar2;
  QList<QListWidgetItem_*> *this_00;
  int in_EDX;
  int in_ESI;
  parameter_type in_RDI;
  long in_FS_OFFSET;
  int r;
  QListWidgetItem *itm;
  QListWidget *view;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar3;
  iterator in_stack_ffffffffffffff88;
  __atomic_base<int> local_6c;
  bool local_39;
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = true;
  if ((0 < in_EDX) && (uVar3 = true, -1 < in_ESI)) {
    QModelIndex::QModelIndex((QModelIndex *)0x89a9e7);
    iVar1 = (*in_RDI->_vptr_QListWidgetItem[0xf])(in_RDI,local_20);
    uVar3 = true;
    if (in_ESI <= iVar1) {
      uVar3 = QModelIndex::isValid
                        ((QModelIndex *)
                         CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    }
  }
  if ((bool)uVar3 == false) {
    QModelIndex::QModelIndex((QModelIndex *)0x89aa36);
    QAbstractItemModel::beginInsertRows((QModelIndex *)in_RDI,(int)local_38,in_ESI);
    pQVar2 = QListModel::view((QListModel *)0x89aa5e);
    for (local_6c._M_i = in_ESI; local_6c._M_i < in_ESI + in_EDX; local_6c._M_i = local_6c._M_i + 1)
    {
      this_00 = (QList<QListWidgetItem_*> *)operator_new(0x28);
      QListWidgetItem::QListWidgetItem
                ((QListWidgetItem *)in_stack_ffffffffffffff88.i,
                 (QListWidget *)CONCAT17(uVar3,in_stack_ffffffffffffff80),
                 (int)((ulong)in_RDI >> 0x20));
      (this_00->d).size = (qsizetype)pQVar2;
      this_00[1].d.d[2].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i = local_6c._M_i
      ;
      in_stack_ffffffffffffff88 =
           QList<QListWidgetItem_*>::insert
                     (this_00,CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),in_RDI);
    }
    QAbstractItemModel::endInsertRows();
    local_39 = true;
  }
  else {
    local_39 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool QListModel::insertRows(int row, int count, const QModelIndex &parent)
{
    if (count < 1 || row < 0 || row > rowCount() || parent.isValid())
        return false;

    beginInsertRows(QModelIndex(), row, row + count - 1);
    QListWidget *view = this->view();
    QListWidgetItem *itm = nullptr;

    for (int r = row; r < row + count; ++r) {
        itm = new QListWidgetItem;
        itm->view = view;
        itm->d->theid = r;
        items.insert(r, itm);
    }

    endInsertRows();
    return true;
}